

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFAContentModel.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::DFAContentModel::checkUniqueParticleAttribution
          (DFAContentModel *this,SchemaGrammar *pGrammar,GrammarResolver *pGrammarResolver,
          XMLStringPool *pStringPool,XMLValidator *pValidator,uint *pContentSpecOrgURI,
          XMLCh *pComplexTypeName)

{
  uint uVar1;
  QName **ppQVar2;
  Occurence *pOVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  NodeTypes NVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  XMLCh *pXVar8;
  undefined4 extraout_var_02;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  QName *q2;
  ulong uVar13;
  ulong uVar14;
  XMLBuffer buf2;
  XMLBuffer buf1;
  ConflictTableKeeper keeper;
  SubstitutionGroupComparator comparator;
  XMLBuffer local_e0;
  XMLBuffer local_a8;
  XMLValidator *local_70;
  ulong local_68;
  SchemaGrammar *local_60;
  ConflictTableKeeper local_58;
  SubstitutionGroupComparator local_40;
  char **__s;
  
  uVar6 = this->fElemMapSize;
  uVar10 = 0;
  if ((ulong)uVar6 != 0) {
    ppQVar2 = this->fElemMap;
    uVar13 = 0;
    do {
      uVar1 = ppQVar2[uVar13]->fURIId;
      if ((((uVar1 != 0xfffffff1) && (uVar1 != 0xfffffff2)) && (uVar1 != 0xfffffffe)) &&
         (uVar1 != 0xffffffff)) {
        ppQVar2[uVar13]->fURIId = pContentSpecOrgURI[uVar1];
      }
      uVar13 = uVar13 + 1;
    } while (uVar6 != uVar13);
  }
  local_70 = pValidator;
  local_60 = pGrammar;
  local_40.fGrammarResolver = pGrammarResolver;
  local_40.fStringPool = pStringPool;
  iVar5 = (*this->fMemoryManager->_vptr_MemoryManager[3])();
  __s = (char **)CONCAT44(extraout_var,iVar5);
  memset(__s,0,(ulong)this->fElemMapSize << 3);
  local_58.fMemoryManager = this->fMemoryManager;
  local_58.fElemMapSize = this->fElemMapSize;
  local_58.fConflictTable = __s;
  if (local_58.fElemMapSize != 0) {
    uVar13 = 0;
    do {
      iVar5 = (*this->fMemoryManager->_vptr_MemoryManager[3])();
      __s[uVar13] = (char *)CONCAT44(extraout_var_00,iVar5);
      memset((char *)CONCAT44(extraout_var_00,iVar5),0,(ulong)this->fElemMapSize);
      uVar13 = uVar13 + 1;
      uVar10 = (ulong)this->fElemMapSize;
    } while (uVar13 < uVar10);
  }
  uVar6 = this->fTransTableSize;
  if (uVar6 != 0) {
    uVar14 = 0;
    uVar13 = uVar10;
    do {
      if ((int)uVar10 == 0) {
        uVar10 = 0;
      }
      else {
        uVar9 = 0;
        uVar10 = uVar13;
        do {
          uVar13 = uVar9 + 1;
          if ((this->fTransTable[uVar14][uVar9] != 0xffffffff) && (uVar11 = uVar9, uVar13 < uVar10))
          {
            do {
              local_68 = uVar13;
              if ((this->fTransTable[uVar14][uVar11 + 1] != 0xffffffff) &&
                 (__s[uVar9][uVar11 + 1] == '\0')) {
                ppQVar2 = this->fElemMap;
                if (this->fIsMixed == false) {
                  q2 = ppQVar2[uVar11 + 1];
                }
                else if ((ppQVar2[uVar9]->fURIId == 0xffffffff) ||
                        (q2 = ppQVar2[uVar11 + 1], q2->fURIId == 0xffffffff)) goto LAB_002e958c;
                bVar4 = XercesElementWildcard::conflict
                                  (local_60,this->fElemMapType[uVar9],ppQVar2[uVar9],
                                   this->fElemMapType[uVar11 + 1],q2,&local_40);
                if ((bVar4) &&
                   ((((this->fCountingStates == (Occurence **)0x0 ||
                      (pOVar3 = this->fCountingStates[uVar14], pOVar3 == (Occurence *)0x0)) ||
                     ((uVar14 == this->fTransTable[uVar14][uVar9]) ==
                      (uVar14 == this->fTransTable[uVar14][uVar11 + 1]))) ||
                    (pOVar3->minOccurs != pOVar3->maxOccurs)))) {
                  __s[uVar9][uVar11 + 1] = '\x01';
                  local_a8.fMemoryManager = this->fMemoryManager;
                  local_a8.fIndex = 0;
                  local_a8.fCapacity = 0x3ff;
                  local_a8.fFullSize = 0;
                  local_a8.fUsed = false;
                  local_a8.fFullHandler = (XMLBufferFullHandler *)0x0;
                  local_a8.fBuffer = (XMLCh *)0x0;
                  iVar5 = (*(local_a8.fMemoryManager)->_vptr_MemoryManager[3])
                                    (local_a8.fMemoryManager,0x800);
                  local_a8.fBuffer = (XMLCh *)CONCAT44(extraout_var_01,iVar5);
                  *local_a8.fBuffer = L'\0';
                  NVar7 = this->fElemMapType[uVar9] & (Any_NS|Any_Other);
                  if (NVar7 == Any_NS) {
LAB_002e96a8:
                    pXVar8 = L"##any";
LAB_002e96fa:
                    local_a8.fIndex = 0;
                    if (*pXVar8 != L'\0') {
                      XMLBuffer::append(&local_a8,pXVar8);
                    }
                  }
                  else {
                    if (NVar7 == Any_Other) {
                      pXVar8 = L"##other";
                      goto LAB_002e96fa;
                    }
                    if (NVar7 == Any) goto LAB_002e96a8;
                    pXVar8 = QName::getRawName(this->fElemMap[uVar9]);
                    local_a8.fIndex = 0;
                    if (pXVar8 != (XMLCh *)0x0) goto LAB_002e96fa;
                  }
                  local_e0.fMemoryManager = this->fMemoryManager;
                  local_e0.fIndex = 0;
                  local_e0.fCapacity = 0x3ff;
                  local_e0.fFullSize = 0;
                  local_e0.fUsed = false;
                  local_e0.fFullHandler = (XMLBufferFullHandler *)0x0;
                  local_e0.fBuffer = (XMLCh *)0x0;
                  iVar5 = (*(local_e0.fMemoryManager)->_vptr_MemoryManager[3])
                                    (local_e0.fMemoryManager,0x800);
                  local_e0.fBuffer = (XMLCh *)CONCAT44(extraout_var_02,iVar5);
                  *local_e0.fBuffer = L'\0';
                  NVar7 = this->fElemMapType[uVar11 + 1] & (Any_NS|Any_Other);
                  if (NVar7 == Any_NS) {
LAB_002e976b:
                    pXVar8 = L"##any";
LAB_002e97ab:
                    local_e0.fIndex = 0;
                    if (*pXVar8 != L'\0') {
                      XMLBuffer::append(&local_e0,pXVar8);
                    }
                  }
                  else {
                    if (NVar7 == Any_Other) {
                      pXVar8 = L"##other";
                      goto LAB_002e97ab;
                    }
                    if (NVar7 == Any) goto LAB_002e976b;
                    pXVar8 = QName::getRawName(this->fElemMap[uVar11 + 1]);
                    local_e0.fIndex = 0;
                    if (pXVar8 != (XMLCh *)0x0) goto LAB_002e97ab;
                  }
                  local_a8.fBuffer[local_a8.fIndex] = L'\0';
                  local_e0.fBuffer[local_e0.fIndex] = L'\0';
                  XMLValidator::emitError
                            (local_70,UniqueParticleAttributionFail,pComplexTypeName,
                             local_a8.fBuffer,local_e0.fBuffer,(XMLCh *)0x0);
                  (*(local_e0.fMemoryManager)->_vptr_MemoryManager[4])
                            (local_e0.fMemoryManager,local_e0.fBuffer);
                  (*(local_a8.fMemoryManager)->_vptr_MemoryManager[4])
                            (local_a8.fMemoryManager,local_a8.fBuffer);
                }
                else {
                  __s[uVar9][uVar11 + 1] = -1;
                }
              }
LAB_002e958c:
              uVar10 = (ulong)this->fElemMapSize;
              uVar12 = uVar11 + 2;
              uVar13 = local_68;
              uVar11 = uVar11 + 1;
            } while (uVar12 < uVar10);
          }
          uVar9 = uVar13;
        } while (uVar13 < uVar10);
        uVar6 = this->fTransTableSize;
        uVar13 = uVar10;
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < uVar6);
  }
  checkUniqueParticleAttribution::ConflictTableKeeper::~ConflictTableKeeper(&local_58);
  return;
}

Assistant:

void DFAContentModel::checkUniqueParticleAttribution (SchemaGrammar*    const pGrammar,
                                                      GrammarResolver*  const pGrammarResolver,
                                                      XMLStringPool*    const pStringPool,
                                                      XMLValidator*     const pValidator,
                                                      unsigned int*     const pContentSpecOrgURI,
                                                      const XMLCh*            pComplexTypeName /*= 0*/)
{

    SubstitutionGroupComparator comparator(pGrammarResolver, pStringPool);

    unsigned int i, j, k;

    // Rename the URI back
    for (i = 0; i < fElemMapSize; i++) {

        unsigned int orgURIIndex = fElemMap[i]->getURI();

        if ((orgURIIndex != XMLContentModel::gEOCFakeId) &&
            (orgURIIndex != XMLContentModel::gEpsilonFakeId) &&
            (orgURIIndex != XMLElementDecl::fgInvalidElemId) &&
            (orgURIIndex != XMLElementDecl::fgPCDataElemId)) {
            fElemMap[i]->setURI(pContentSpecOrgURI[orgURIIndex]);
        }
    }

    // Unique Particle Attribution
    // Store the conflict results between any two elements in fElemMap
    // 0 - not yet tested, 1 - conflict, (-1) - no conflict
    signed char** conflictTable = (signed char**) fMemoryManager->allocate
    (
        fElemMapSize * sizeof(signed char*)
    );
    memset(conflictTable, 0, fElemMapSize * sizeof(signed char*));

    struct ConflictTableKeeper
    {
        MemoryManager* fMemoryManager;
        signed char**  fConflictTable;
        unsigned int   fElemMapSize;

        ConflictTableKeeper(MemoryManager* memoryManager,
                            signed char** conflictTable,
                            unsigned int elemMapSize):
            fMemoryManager(memoryManager),
            fConflictTable(conflictTable),
            fElemMapSize(elemMapSize)
        {
        }

        ~ConflictTableKeeper()
        {
            for (int i = 0; i < fElemMapSize; i++)
                fMemoryManager->deallocate(fConflictTable[i]);
            fMemoryManager->deallocate(fConflictTable);
        }
    };

    ConflictTableKeeper keeper(fMemoryManager, conflictTable, fElemMapSize);

    // initialize the conflict table
    for (j = 0; j < fElemMapSize; j++) {
        conflictTable[j] = (signed char*) fMemoryManager->allocate
        (
            fElemMapSize * sizeof(signed char)
        );
        memset(conflictTable[j], 0, fElemMapSize*sizeof(signed char));
    }

    // for each state, check whether it has overlap transitions
    for (i = 0; i < fTransTableSize; i++) {
        for (j = 0; j < fElemMapSize; j++) {
            if (fTransTable[i][j] == XMLContentModel::gInvalidTrans)
                continue;
            for (k = j+1; k < fElemMapSize; k++) {
                if (fTransTable[i][k] != XMLContentModel::gInvalidTrans &&
                    conflictTable[j][k] == 0) {

                    // If this is text in a Schema mixed content model, skip it.
                    if ( fIsMixed &&
                         (( fElemMap[j]->getURI() == XMLElementDecl::fgPCDataElemId) ||
                          ( fElemMap[k]->getURI() == XMLElementDecl::fgPCDataElemId)))
                        continue;

                    if (XercesElementWildcard::conflict(pGrammar,
                                                        fElemMapType[j],
                                                        fElemMap[j],
                                                        fElemMapType[k],
                                                        fElemMap[k],
                                                        &comparator)) {
                        if (fCountingStates != 0) {
                            Occurence* o = fCountingStates[i];
                            // If "i" is a counting state and exactly one of the transitions
                            // loops back to "i" then the two particles do not overlap if
                            // minOccurs == maxOccurs.
                            if (o != 0 &&
                                ((fTransTable[i][j] == i) ^ (fTransTable[i][k] == i)) &&
                                o->minOccurs == o->maxOccurs) {
                                conflictTable[j][k] = -1;
                                continue;
                            }
                        }
                       conflictTable[j][k] = 1;

                       XMLBuffer buf1(1023, fMemoryManager);
                       if (((fElemMapType[j] & 0x0f) == ContentSpecNode::Any) ||
                           ((fElemMapType[j] & 0x0f) == ContentSpecNode::Any_NS))
                           buf1.set(SchemaSymbols::fgATTVAL_TWOPOUNDANY);
                       else if ((fElemMapType[j] & 0x0f) == ContentSpecNode::Any_Other)
                           buf1.set(SchemaSymbols::fgATTVAL_TWOPOUNDOTHER);
                       else
                           buf1.set(fElemMap[j]->getRawName());

                       XMLBuffer buf2(1023, fMemoryManager);
                       if (((fElemMapType[k] & 0x0f) == ContentSpecNode::Any) ||
                           ((fElemMapType[k] & 0x0f) == ContentSpecNode::Any_NS))
                           buf2.set(SchemaSymbols::fgATTVAL_TWOPOUNDANY);
                       else if ((fElemMapType[k] & 0x0f) == ContentSpecNode::Any_Other)
                           buf2.set(SchemaSymbols::fgATTVAL_TWOPOUNDOTHER);
                       else
                           buf2.set(fElemMap[k]->getRawName());

                       pValidator->emitError(XMLValid::UniqueParticleAttributionFail,
                                             pComplexTypeName,
                                             buf1.getRawBuffer(),
                                             buf2.getRawBuffer());
                    }
                    else
                        conflictTable[j][k] = -1;
                }
            }
        }
    }
}